

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

optional<unsigned_long> find_in_table(token *token,char **table,string_view prefix)

{
  long lVar1;
  int iVar2;
  _Storage<unsigned_long,_true> _Var3;
  _Storage<unsigned_long,_true> _Var4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  size_type __rlen;
  _Storage<unsigned_long,_true> _Var6;
  char *__s;
  char *__s2;
  _Storage<unsigned_long,_true> unaff_R15;
  optional<unsigned_long> oVar7;
  
  _Var4._M_value = prefix._M_len;
  if (token->type == identifier) {
    _Var6 = (_Storage<unsigned_long,_true>)(token->data).string._M_len;
    __s2 = (token->data).string._M_str;
    if (_Var4._M_value == 0) {
LAB_0012e8a5:
      unaff_R15._M_value = 0;
      __s = *table;
      while (__s != (char *)0x0) {
        _Var3._M_value = strlen(__s);
        _Var4._M_value = _Var3._M_value;
        if (_Var6._M_value < _Var3._M_value) {
          _Var4 = _Var6;
        }
        if (_Var4._M_value == 0) {
          uVar5 = 0;
          if (_Var6._M_value == _Var3._M_value) goto LAB_0012e8f9;
        }
        else {
          iVar2 = bcmp(__s2,__s,_Var4._M_value);
          uVar5 = extraout_RDX;
          if (iVar2 == 0 && _Var6._M_value == _Var3._M_value) {
LAB_0012e8f9:
            uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_0012e8fb;
          }
        }
        lVar1 = unaff_R15._M_value + 1;
        unaff_R15._M_value = unaff_R15._M_value + 1;
        __s = table[lVar1];
      }
      uVar5 = 0;
      goto LAB_0012e8fb;
    }
    unaff_R15._M_value = _Var4._M_value;
    if (_Var6._M_value != 0) {
      _Var3 = _Var6;
      if (_Var4._M_value <= _Var6._M_value) {
        _Var3._M_value = _Var4._M_value;
      }
      iVar2 = bcmp(prefix._M_str,__s2,_Var3._M_value);
      if (iVar2 == 0 && _Var4._M_value <= _Var6._M_value) {
        __s2 = __s2 + _Var4._M_value;
        _Var6._M_value = _Var6._M_value - _Var4._M_value;
        goto LAB_0012e8a5;
      }
    }
  }
  uVar5 = 0;
LAB_0012e8fb:
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R15._M_value;
  return (optional<unsigned_long>)
         oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> find_in_table(const token& token, const char* const* table,
                                      std::string_view prefix)
{
    if (token.type != token_type::identifier) {
        return {};
    }

    std::string_view text = token.data.string;

    if (!prefix.empty()) {
        if (prefix.compare(text.substr(0, std::size(prefix))) != 0) {
            return {};
        }
        text = text.substr(std::size(prefix));
    }

    for (size_t i = 0; table[i]; ++i) {
        if (text.compare(table[i]) != 0) {
            continue;
        }
        return static_cast<uint64_t>(i);
    }
    return {};
}